

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_reader.cpp
# Opt level: O0

buffer_reader * __thiscall buffer_reader::operator>>(buffer_reader *this,string *string)

{
  ulong local_28;
  size_t i;
  size_t size;
  string *string_local;
  buffer_reader *this_local;
  
  i = 0;
  size = (size_t)string;
  string_local = (string *)this;
  operator>>(this,&i);
  std::__cxx11::string::resize(size);
  for (local_28 = 0; local_28 < i; local_28 = local_28 + 1) {
  }
  return this;
}

Assistant:

buffer_reader& buffer_reader::operator>>(std::string& string)
{
    std::size_t size = 0;
    *this >> size;
    string.resize(size);

    for(std::size_t i = 0; i < size; ++i)
    {
        //*this >> string[i];
    }

    return *this;
}